

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

char * helicsFederateGetTag(HelicsFederate fed,char *tagName,HelicsError *err)

{
  Federate *this;
  HelicsError *in_RDX;
  long in_RSI;
  string *str;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffa8;
  Federate *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  char *local_8;
  
  this = getFed(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (this == (Federate *)0x0) {
    local_8 = "";
  }
  else if (in_RSI == 0) {
    assignError(in_RDX,-4,"Tag name cannot be null");
    local_8 = "";
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
               (char *)in_stack_ffffffffffffffa8);
    helics::Federate::getTag_abi_cxx11_(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  return local_8;
}

Assistant:

const char* helicsFederateGetTag(HelicsFederate fed, const char* tagName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullcstr;
    }
    if (tagName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidTagString);
        return nullcstr;
    }
    try {
        const auto& str = fedObj->getTag(tagName);
        return str.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullcstr;
    }
    // LCOV_EXCL_STOP
}